

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xform.cc
# Opt level: O2

matrix4d *
tinyusdz::trs_angle_xyz
          (matrix4d *__return_storage_ptr__,double3 *translation,double3 *rotation_angles_xyz,
          double3 *scale)

{
  value_type *pvVar1;
  matrix4d *n;
  matrix4d *pmVar2;
  byte bVar3;
  expected<tinyusdz::value::matrix4d,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ret;
  XformEvaluator eval;
  matrix4d ret_1;
  matrix4d m_1;
  matrix4d m;
  matrix4d rMat;
  
  bVar3 = 0;
  __return_storage_ptr__->m[0][0] = 1.0;
  __return_storage_ptr__->m[0][1] = 0.0;
  __return_storage_ptr__->m[0][2] = 0.0;
  __return_storage_ptr__->m[0][3] = 0.0;
  __return_storage_ptr__->m[1][0] = 0.0;
  __return_storage_ptr__->m[1][1] = 1.0;
  __return_storage_ptr__->m[1][2] = 0.0;
  __return_storage_ptr__->m[1][3] = 0.0;
  __return_storage_ptr__->m[2][0] = 0.0;
  __return_storage_ptr__->m[2][1] = 0.0;
  __return_storage_ptr__->m[2][2] = 1.0;
  __return_storage_ptr__->m[2][3] = 0.0;
  __return_storage_ptr__->m[3][0] = 0.0;
  __return_storage_ptr__->m[3][1] = 0.0;
  __return_storage_ptr__->m[3][2] = 0.0;
  __return_storage_ptr__->m[3][3] = 1.0;
  anon_unknown_4::XformEvaluator::XformEvaluator(&eval);
  anon_unknown_4::XformEvaluator::RotateX(&eval,rotation_angles_xyz->_M_elems[0]);
  anon_unknown_4::XformEvaluator::RotateY(&eval,rotation_angles_xyz->_M_elems[1]);
  anon_unknown_4::XformEvaluator::RotateZ(&eval,rotation_angles_xyz->_M_elems[2]);
  (anonymous_namespace)::XformEvaluator::result_abi_cxx11_(&ret,&eval);
  if (ret.contained.
      super_storage_t_impl<tinyusdz::value::matrix4d,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      .m_has_value == true) {
    pvVar1 = nonstd::expected_lite::
             expected<tinyusdz::value::matrix4d,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::value(&ret);
    pmVar2 = &rMat;
    for (n = (matrix4d *)0x10; n != (matrix4d *)0x0; n = (matrix4d *)((long)n[-1].m[3] + 0x1f)) {
      pmVar2->m[0][0] = pvVar1->m[0][0];
      pvVar1 = (value_type *)((long)pvVar1 + ((ulong)bVar3 * -2 + 1) * 8);
      pmVar2 = (matrix4d *)((long)pmVar2 + ((ulong)bVar3 * -2 + 1) * 8);
    }
    m.m[0][0] = 1.0;
    m.m[0][1] = 0.0;
    m.m[0][2] = 0.0;
    m.m[0][3] = 0.0;
    m.m[1][0] = 0.0;
    m.m[1][1] = 1.0;
    m.m[1][2] = 0.0;
    m.m[1][3] = 0.0;
    m.m[2][0] = 0.0;
    m.m[2][1] = 0.0;
    m.m[2][2] = 1.0;
    m.m[2][3] = 0.0;
    m.m[3][3] = 1.0;
    m.m[3][0] = translation->_M_elems[0];
    m.m[3][1] = translation->_M_elems[1];
    m.m[3][2] = translation->_M_elems[2];
    m_1.m[0][3] = 0.0;
    m_1.m[1][0] = 0.0;
    m_1.m[0][1] = 0.0;
    m_1.m[0][2] = 0.0;
    m_1.m[1][2] = 0.0;
    m_1.m[1][3] = 0.0;
    m_1.m[2][0] = 0.0;
    m_1.m[2][1] = 0.0;
    m_1.m[2][3] = 0.0;
    m_1.m[3][0] = 0.0;
    m_1.m[3][1] = 0.0;
    m_1.m[3][2] = 0.0;
    m_1.m[3][3] = 1.0;
    m_1.m[0][0] = scale->_M_elems[0];
    m_1.m[1][1] = scale->_M_elems[1];
    m_1.m[2][2] = scale->_M_elems[2];
    value::Mult<tinyusdz::value::matrix4d,double,4ul>(&ret_1,(value *)&m_1,&rMat,(matrix4d *)0x0);
    value::Mult<tinyusdz::value::matrix4d,double,4ul>(__return_storage_ptr__,(value *)&ret_1,&m,n);
  }
  nonstd::expected_lite::
  expected<tinyusdz::value::matrix4d,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~expected(&ret);
  std::__cxx11::string::_M_dispose();
  return __return_storage_ptr__;
}

Assistant:

value::matrix4d trs_angle_xyz(const value::double3 &translation,
                              const value::double3 &rotation_angles_xyz,
                              const value::double3 &scale) {
  value::matrix4d m{value::matrix4d::identity()};

  XformEvaluator eval;
#if defined(PXR_COMPATIBLE_ROTATE_MATRIX_GENERATION)
  eval.Rotation({1.0, 0.0, 0.0}, rotation_angles_xyz[0]);
  eval.Rotation({0.0, 1.0, 0.0}, rotation_angles_xyz[1]);
  eval.Rotation({0.0, 0.0, 1.0}, rotation_angles_xyz[2]);
#else
  eval.RotateX(rotation_angles_xyz[0]);
  eval.RotateY(rotation_angles_xyz[1]);
  eval.RotateZ(rotation_angles_xyz[2]);
#endif

  auto ret = eval.result();
  if (!ret) {
    // This should not happend though.
    return m;
  }
  value::matrix4d rMat = ret.value();

  value::matrix4d tMat{value::matrix4d::identity()};
  tMat.m[3][0] = translation[0];
  tMat.m[3][1] = translation[1];
  tMat.m[3][2] = translation[2];

  value::matrix4d sMat{value::matrix4d::identity()};
  sMat.m[0][0] = scale[0];
  sMat.m[1][1] = scale[1];
  sMat.m[2][2] = scale[2];

  m = sMat * rMat * tMat;

  return m;
}